

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockReturnValueTest.cpp
# Opt level: O3

void __thiscall
TEST_GROUP_CppUTestGroupMockReturnValueTest::teardown
          (TEST_GROUP_CppUTestGroupMockReturnValueTest *this)

{
  MockSupport *pMVar1;
  SimpleString SStack_18;
  
  SimpleString::SimpleString(&SStack_18,"");
  pMVar1 = mock(&SStack_18,(MockFailureReporter *)0x0);
  (*pMVar1->_vptr_MockSupport[0x25])(pMVar1);
  SimpleString::~SimpleString(&SStack_18);
  SimpleString::SimpleString(&SStack_18,"");
  pMVar1 = mock(&SStack_18,(MockFailureReporter *)0x0);
  (*pMVar1->_vptr_MockSupport[0x27])(pMVar1);
  SimpleString::~SimpleString(&SStack_18);
  return;
}

Assistant:

void teardown() _override
  {
      mock().checkExpectations();
      mock().clear();
  }